

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O3

void __thiscall
phpconvert::ZendParser::generatePreparedTypesGlobal
          (ZendParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmp)

{
  pointer outPrep;
  
  outPrep = (this->typesRegistry->
            super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (outPrep !=
      (this->typesRegistry->
      super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      generatePreparedTypeFull(this,outPrep,tmp);
      outPrep = outPrep + 1;
    } while (outPrep !=
             (this->typesRegistry->
             super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypesGlobal(vector<string> &tmp) {
        vector<PreparedType>::iterator type = typesRegistry->begin();
        for (; type != typesRegistry->end(); ++type) {
            generatePreparedTypeFull(*type, tmp);
        }
    }